

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

lys_node * lys_is_disabled(lys_node *node,int recursive)

{
  int iVar1;
  int local_20;
  int i;
  int recursive_local;
  lys_node *node_local;
  
  _i = node;
  if (node != (lys_node *)0x0) {
    do {
      if ((_i->nodetype != LYS_INPUT) && (_i->nodetype != LYS_OUTPUT)) {
        for (local_20 = 0; local_20 < (int)(uint)_i->iffeature_size; local_20 = local_20 + 1) {
          iVar1 = resolve_iffeature(_i->iffeature + local_20);
          if (iVar1 == 0) {
            return _i;
          }
        }
      }
      if (recursive == 0) {
        return (lys_node *)0x0;
      }
      if (_i->nodetype == LYS_AUGMENT) {
        _i = _i->prev;
        if (_i == (lys_node *)0x0) {
          return (lys_node *)0x0;
        }
      }
      else {
        if (_i->parent == (lys_node *)0x0) {
          return (lys_node *)0x0;
        }
        _i = _i->parent;
      }
    } while ((recursive != 2) ||
            ((_i->nodetype & (LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CONTAINER)) == LYS_UNKNOWN));
  }
  return (lys_node *)0x0;
}

Assistant:

lys_node *
lys_is_disabled(const struct lys_node *node, int recursive)
{
    int i;

    if (!node) {
        return NULL;
    }

check:
    if (node->nodetype != LYS_INPUT && node->nodetype != LYS_OUTPUT) {
        /* input/output does not have if-feature, so skip them */

        /* check local if-features */
        for (i = 0; i < node->iffeature_size; i++) {
            if (!resolve_iffeature(&node->iffeature[i])) {
                return node;
            }
        }
    }

    if (!recursive) {
        return NULL;
    }

    /* go through parents */
    if (node->nodetype == LYS_AUGMENT) {
        /* go to parent actually means go to the target node */
        node = ((struct lys_node_augment *)node)->target;
        if (!node) {
            /* unresolved augment, let's say it's enabled */
            return NULL;
        }
    } else if (node->parent) {
        node = node->parent;
    } else {
        return NULL;
    }

    if (recursive == 2) {
        /* continue only if the node cannot have a data instance */
        if (node->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST)) {
            return NULL;
        }
    }
    goto check;
}